

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O1

Gia_Man_t *
Gia_ManCorrSpecReduce(Gia_Man_t *p,int nFrames,int fScorr,Vec_Int_t **pvOutputs,int fRings)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int *piVar8;
  Gia_Man_t *p_00;
  size_t sVar9;
  char *pcVar10;
  Gia_Obj_t *pGVar11;
  Vec_Int_t *pVVar12;
  Gia_Man_t *pGVar13;
  Gia_Obj_t *pGVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  Gia_Obj_t *pGVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  
  if (nFrames < 1) {
    __assert_fail("nFrames > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCorr.c"
                  ,0x70,"Gia_Man_t *Gia_ManCorrSpecReduce(Gia_Man_t *, int, int, Vec_Int_t **, int)"
                 );
  }
  if (p->nRegs < 1) {
    __assert_fail("Gia_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCorr.c"
                  ,0x71,"Gia_Man_t *Gia_ManCorrSpecReduce(Gia_Man_t *, int, int, Vec_Int_t **, int)"
                 );
  }
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    __assert_fail("p->pReprs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCorr.c"
                  ,0x72,"Gia_Man_t *Gia_ManCorrSpecReduce(Gia_Man_t *, int, int, Vec_Int_t **, int)"
                 );
  }
  iVar15 = fScorr + nFrames;
  uVar22 = (long)iVar15 * (long)p->nObjs;
  iVar21 = (int)uVar22;
  if ((p->vCopies).nCap < iVar21) {
    piVar8 = (p->vCopies).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc(uVar22 * 4);
    }
    else {
      piVar8 = (int *)realloc(piVar8,uVar22 * 4);
    }
    (p->vCopies).pArray = piVar8;
    if (piVar8 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vCopies).nCap = iVar21;
  }
  if (0 < iVar21) {
    memset((p->vCopies).pArray,0xff,(uVar22 & 0xffffffff) << 2);
  }
  (p->vCopies).nSize = iVar21;
  Gia_ManSetPhase(p);
  p_00 = Gia_ManStart(p->nObjs * nFrames);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar2);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar2);
  }
  p_00->pName = pcVar10;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar2);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar2);
  }
  p_00->pSpec = pcVar10;
  Gia_ManHashAlloc(p_00);
  if (p->nObjs < 1) {
LAB_0063f333:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  if ((p->vCopies).nSize < 1) {
LAB_0063f371:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  *(p->vCopies).pArray = 0;
  iVar21 = p->nRegs;
  if (0 < iVar21) {
    iVar18 = 0;
    do {
      iVar1 = p->vCis->nSize;
      uVar16 = (iVar1 - iVar21) + iVar18;
      if (((int)uVar16 < 0) || (iVar1 <= (int)uVar16)) goto LAB_0063f390;
      iVar21 = p->vCis->pArray[uVar16];
      if (((long)iVar21 < 0) || (p->nObjs <= iVar21)) goto LAB_0063f352;
      pGVar14 = p->pObjs;
      if (pGVar14 == (Gia_Obj_t *)0x0) break;
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar22 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar22 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar22 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar20 = p_00->pObjs;
      if ((pGVar11 < pGVar20) || (pGVar20 + p_00->nObjs <= pGVar11)) goto LAB_0063f333;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar20) >> 2) * -0x55555555);
      pGVar20 = p_00->pObjs;
      if ((pGVar11 < pGVar20) || (pGVar20 + p_00->nObjs <= pGVar11)) goto LAB_0063f333;
      pGVar14 = pGVar14 + iVar21;
      pGVar3 = p->pObjs;
      if ((pGVar14 < pGVar3) || (pGVar3 + p->nObjs <= pGVar14)) goto LAB_0063f333;
      uVar16 = (int)((long)pGVar14 - (long)pGVar3 >> 2) * -0x55555555;
      if (((int)uVar16 < 0) || ((p->vCopies).nSize <= (int)uVar16)) goto LAB_0063f371;
      (p->vCopies).pArray[uVar16 & 0x7fffffff] =
           (int)((ulong)((long)pGVar11 - (long)pGVar20) >> 2) * 0x55555556;
      iVar18 = iVar18 + 1;
      iVar21 = p->nRegs;
    } while (iVar18 < iVar21);
  }
  iVar21 = p->nRegs;
  if (0 < iVar21) {
    pVVar12 = p->vCis;
    iVar18 = 0;
    do {
      iVar1 = pVVar12->nSize;
      uVar16 = (iVar1 - iVar21) + iVar18;
      if (((int)uVar16 < 0) || (iVar1 <= (int)uVar16)) {
LAB_0063f390:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar21 = pVVar12->pArray[uVar16];
      lVar19 = (long)iVar21;
      if (lVar19 < 0) goto LAB_0063f352;
      iVar1 = p->nObjs;
      if (iVar1 <= iVar21) goto LAB_0063f352;
      pGVar14 = p->pObjs;
      if (pGVar14 == (Gia_Obj_t *)0x0) break;
      uVar22 = (ulong)(uint)p->pReprs[lVar19] & 0xfffffff;
      if (uVar22 == 0xfffffff) {
        pGVar20 = (Gia_Obj_t *)0x0;
      }
      else {
        if (iVar1 <= (int)uVar22) goto LAB_0063f352;
        pGVar20 = pGVar14 + uVar22;
      }
      if (pGVar20 != (Gia_Obj_t *)0x0) {
        if ((pGVar20 < pGVar14) || (pGVar14 + iVar1 <= pGVar20)) goto LAB_0063f333;
        uVar16 = (int)((long)pGVar20 - (long)pGVar14 >> 2) * -0x55555555;
        if (((int)uVar16 < 0) || (iVar1 = (p->vCopies).nSize, iVar1 <= (int)uVar16))
        goto LAB_0063f390;
        if (iVar1 <= iVar21) goto LAB_0063f371;
        piVar8 = (p->vCopies).pArray;
        piVar8[lVar19] = piVar8[uVar16 & 0x7fffffff];
      }
      iVar18 = iVar18 + 1;
      iVar21 = p->nRegs;
    } while (iVar18 < iVar21);
  }
  if (0 < iVar15) {
    iVar21 = 0;
    do {
      if (p->nObjs < 1) goto LAB_0063f333;
      uVar16 = p->nObjs * iVar21;
      if (((int)uVar16 < 0) || ((p->vCopies).nSize <= (int)uVar16)) goto LAB_0063f371;
      (p->vCopies).pArray[uVar16] = 0;
      pVVar12 = p->vCis;
      uVar22 = (ulong)(uint)pVVar12->nSize;
      if (p->nRegs < pVVar12->nSize) {
        lVar19 = 0;
        do {
          if ((int)uVar22 <= lVar19) goto LAB_0063f390;
          iVar18 = pVVar12->pArray[lVar19];
          if (((long)iVar18 < 0) || (p->nObjs <= iVar18)) goto LAB_0063f352;
          pGVar14 = p->pObjs;
          if (pGVar14 == (Gia_Obj_t *)0x0) break;
          pGVar11 = Gia_ManAppendObj(p_00);
          uVar22 = *(ulong *)pGVar11;
          *(ulong *)pGVar11 = uVar22 | 0x9fffffff;
          *(ulong *)pGVar11 =
               uVar22 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar20 = p_00->pObjs;
          if ((pGVar11 < pGVar20) || (pGVar20 + p_00->nObjs <= pGVar11)) goto LAB_0063f333;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar20) >> 2) * -0x55555555);
          pGVar20 = p_00->pObjs;
          if ((pGVar11 < pGVar20) || (pGVar20 + p_00->nObjs <= pGVar11)) goto LAB_0063f333;
          pGVar14 = pGVar14 + iVar18;
          pGVar3 = p->pObjs;
          if ((pGVar14 < pGVar3) || (pGVar3 + p->nObjs <= pGVar14)) goto LAB_0063f333;
          uVar16 = (int)((ulong)((long)pGVar14 - (long)pGVar3) >> 2) * -0x55555555 +
                   p->nObjs * iVar21;
          if (((int)uVar16 < 0) || ((p->vCopies).nSize <= (int)uVar16)) goto LAB_0063f371;
          (p->vCopies).pArray[uVar16] =
               (int)((ulong)((long)pGVar11 - (long)pGVar20) >> 2) * 0x55555556;
          lVar19 = lVar19 + 1;
          pVVar12 = p->vCis;
          uVar22 = (ulong)pVVar12->nSize;
        } while (lVar19 < (long)(uVar22 - (long)p->nRegs));
      }
      iVar21 = iVar21 + 1;
    } while (iVar21 != iVar15);
  }
  pVVar12 = (Vec_Int_t *)malloc(0x10);
  pVVar12->nCap = 1000;
  pVVar12->nSize = 0;
  piVar8 = (int *)malloc(4000);
  pVVar12->pArray = piVar8;
  *pvOutputs = pVVar12;
  pVVar12 = (Vec_Int_t *)malloc(0x10);
  pVVar12->nCap = 1000;
  pVVar12->nSize = 0;
  piVar8 = (int *)malloc(4000);
  pVVar12->pArray = piVar8;
  uVar16 = p->nObjs;
  uVar22 = (ulong)uVar16;
  if (fRings == 0) {
    if (1 < (int)uVar16) {
      lVar19 = 1;
      lVar23 = 0xc;
      do {
        pGVar14 = p->pObjs;
        uVar17 = (ulong)(uint)p->pReprs[lVar19] & 0xfffffff;
        if (uVar17 == 0xfffffff) {
          pGVar20 = (Gia_Obj_t *)0x0;
        }
        else {
          if ((int)uVar22 <= (int)uVar17) goto LAB_0063f352;
          pGVar20 = pGVar14 + uVar17;
        }
        if (pGVar20 != (Gia_Obj_t *)0x0) {
          if (((uint)p->pReprs[lVar19] & 0xfffffff) == 0) {
            uVar16 = 0;
          }
          else {
            uVar16 = Gia_ManCorrSpecReal(p_00,p,pGVar20,nFrames,0);
          }
          pGVar11 = (Gia_Obj_t *)(&pGVar14->field_0x0 + lVar23);
          uVar7 = Gia_ManCorrSpecReal(p_00,p,pGVar11,nFrames,0);
          if ((int)uVar7 < 0) goto LAB_0063f3af;
          uVar7 = uVar7 ^ ((uint)((ulong)*(undefined8 *)pGVar20 >> 0x20) ^
                          (uint)((ulong)*(undefined8 *)pGVar11 >> 0x20)) >> 0x1f;
          if (uVar16 != uVar7) {
            pGVar3 = p->pObjs;
            if ((pGVar20 < pGVar3) || (pGVar3 + p->nObjs <= pGVar20)) goto LAB_0063f333;
            Vec_IntPush(*pvOutputs,(int)((ulong)((long)pGVar20 - (long)pGVar3) >> 2) * -0x55555555);
            pGVar20 = p->pObjs;
            if ((pGVar11 < pGVar20) || (pGVar20 + p->nObjs <= pGVar11)) goto LAB_0063f333;
            Vec_IntPush(*pvOutputs,
                        (int)((ulong)((long)pGVar14 + (lVar23 - (long)pGVar20)) >> 2) * -0x55555555)
            ;
            iVar15 = Gia_ManHashXor(p_00,uVar16,uVar7);
            Vec_IntPush(pVVar12,iVar15);
          }
        }
        lVar19 = lVar19 + 1;
        uVar22 = (ulong)p->nObjs;
        lVar23 = lVar23 + 0xc;
      } while (lVar19 < (long)uVar22);
    }
  }
  else if (1 < (int)uVar16) {
    uVar22 = 1;
    do {
      pGVar14 = p->pObjs + uVar22;
      uVar16 = (uint)p->pReprs[uVar22] & 0xfffffff;
      uVar7 = (uint)uVar22;
      if (uVar16 == 0) {
        uVar16 = Gia_ManCorrSpecReal(p_00,p,pGVar14,nFrames,0);
        if ((int)uVar16 < 0) goto LAB_0063f3af;
        uVar4 = -(int)((long)*(undefined8 *)pGVar14 >> 0x3f);
        if (uVar16 != uVar4) {
          uVar16 = uVar16 ^ uVar4;
          Vec_IntPush(*pvOutputs,0);
          Vec_IntPush(*pvOutputs,uVar7);
LAB_0063f0ad:
          Vec_IntPush(pVVar12,uVar16);
        }
      }
      else if ((uVar16 == 0xfffffff) && (0 < p->pNexts[uVar22])) {
        if (p->pNexts[uVar22] < 1) {
          __assert_fail("Gia_ObjIsHead(p, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCorr.c"
                        ,0x99,
                        "Gia_Man_t *Gia_ManCorrSpecReduce(Gia_Man_t *, int, int, Vec_Int_t **, int)"
                       );
        }
        uVar4 = p->pNexts[uVar22];
        uVar17 = uVar22 & 0xffffffff;
        uVar16 = uVar7;
        while (uVar6 = uVar4, 0 < (int)uVar6) {
          iVar15 = (int)uVar17;
          if (((iVar15 < 0) || (p->nObjs <= iVar15)) ||
             (uVar16 = Gia_ManCorrSpecReal(p_00,p,p->pObjs + uVar17,nFrames,0),
             p->nObjs <= (int)uVar6)) goto LAB_0063f352;
          uVar4 = Gia_ManCorrSpecReal(p_00,p,p->pObjs + uVar6,nFrames,0);
          if (p->nObjs <= iVar15) goto LAB_0063f352;
          if ((int)uVar16 < 0) goto LAB_0063f3af;
          if (p->nObjs <= (int)uVar6) goto LAB_0063f352;
          if ((int)uVar4 < 0) goto LAB_0063f3af;
          uVar5 = (uint)((ulong)*(undefined8 *)pGVar14 >> 0x20);
          uVar4 = uVar4 ^ ((uint)((ulong)*(undefined8 *)(p->pObjs + uVar6) >> 0x20) ^ uVar5) >> 0x1f
          ;
          if (((uVar4 != 1) &&
              (uVar5 = -((int)(uVar5 ^ (uint)((ulong)*(undefined8 *)(p->pObjs + uVar17) >> 0x20)) >>
                        0x1f), uVar16 != uVar5)) && (uVar16 = uVar16 ^ uVar5, uVar16 != uVar4)) {
            Vec_IntPush(*pvOutputs,iVar15);
            Vec_IntPush(*pvOutputs,uVar6);
            iVar15 = Gia_ManHashAnd(p_00,uVar16,uVar4 ^ 1);
            Vec_IntPush(pVVar12,iVar15);
          }
          uVar17 = (ulong)uVar6;
          uVar16 = uVar6;
          uVar4 = p->pNexts[uVar6];
        }
        if (((int)uVar16 < 0) || (p->nObjs <= (int)uVar16)) {
LAB_0063f352:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        uVar4 = Gia_ManCorrSpecReal(p_00,p,p->pObjs + uVar16,nFrames,0);
        if ((long)p->nObjs <= (long)uVar22) goto LAB_0063f352;
        uVar6 = Gia_ManCorrSpecReal(p_00,p,p->pObjs + uVar22,nFrames,0);
        if (p->nObjs <= (int)uVar16) goto LAB_0063f352;
        if ((int)uVar4 < 0) {
LAB_0063f3af:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        if ((long)p->nObjs <= (long)uVar22) goto LAB_0063f352;
        if ((int)uVar6 < 0) goto LAB_0063f3af;
        uVar5 = (uint)((ulong)*(undefined8 *)pGVar14 >> 0x20);
        uVar6 = uVar6 ^ ((uint)((ulong)*(undefined8 *)(p->pObjs + uVar22) >> 0x20) ^ uVar5) >> 0x1f;
        if (((uVar6 != 1) &&
            (uVar5 = -((int)(uVar5 ^ (uint)((ulong)*(undefined8 *)(p->pObjs + uVar16) >> 0x20)) >>
                      0x1f), uVar4 != uVar5)) && (uVar4 = uVar4 ^ uVar5, uVar4 != uVar6)) {
          Vec_IntPush(*pvOutputs,uVar16);
          Vec_IntPush(*pvOutputs,uVar7);
          uVar16 = Gia_ManHashAnd(p_00,uVar4,uVar6 ^ 1);
          goto LAB_0063f0ad;
        }
      }
      uVar22 = uVar22 + 1;
    } while ((long)uVar22 < (long)p->nObjs);
  }
  iVar15 = pVVar12->nSize;
  if (0 < (long)iVar15) {
    piVar8 = pVVar12->pArray;
    lVar19 = 0;
    do {
      Gia_ManAppendCo(p_00,piVar8[lVar19]);
      lVar19 = lVar19 + 1;
    } while (iVar15 != lVar19);
  }
  if (pVVar12->pArray != (int *)0x0) {
    free(pVVar12->pArray);
    pVVar12->pArray = (int *)0x0;
  }
  free(pVVar12);
  Gia_ManHashStop(p_00);
  piVar8 = (p->vCopies).pArray;
  if (piVar8 != (int *)0x0) {
    free(piVar8);
    (p->vCopies).pArray = (int *)0x0;
  }
  (p->vCopies).nCap = 0;
  (p->vCopies).nSize = 0;
  pGVar13 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar13;
}

Assistant:

Gia_Man_t * Gia_ManCorrSpecReduce( Gia_Man_t * p, int nFrames, int fScorr, Vec_Int_t ** pvOutputs, int fRings )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pRepr;
    Vec_Int_t * vXorLits;
    int f, i, iPrev, iObj, iPrevNew, iObjNew;
    assert( nFrames > 0 );
    assert( Gia_ManRegNum(p) > 0 );
    assert( p->pReprs != NULL );
    Vec_IntFill( &p->vCopies, (nFrames+fScorr)*Gia_ManObjNum(p), -1 );
    Gia_ManSetPhase( p );
    pNew = Gia_ManStart( nFrames * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ObjSetCopyF( p, 0, Gia_ManConst0(p), 0 );
    Gia_ManForEachRo( p, pObj, i )
        Gia_ObjSetCopyF( p, 0, pObj, Gia_ManAppendCi(pNew) );
    Gia_ManForEachRo( p, pObj, i )
        if ( (pRepr = Gia_ObjReprObj(p, Gia_ObjId(p, pObj))) )
            Gia_ObjSetCopyF( p, 0, pObj, Gia_ObjCopyF(p, 0, pRepr) );
    for ( f = 0; f < nFrames+fScorr; f++ )
    { 
        Gia_ObjSetCopyF( p, f, Gia_ManConst0(p), 0 );
        Gia_ManForEachPi( p, pObj, i )
            Gia_ObjSetCopyF( p, f, pObj, Gia_ManAppendCi(pNew) );
    }
    *pvOutputs = Vec_IntAlloc( 1000 );
    vXorLits = Vec_IntAlloc( 1000 );
    if ( fRings )
    {
        Gia_ManForEachObj1( p, pObj, i )
        {
            if ( Gia_ObjIsConst( p, i ) )
            {
                iObjNew = Gia_ManCorrSpecReal( pNew, p, pObj, nFrames, 0 );
                iObjNew = Abc_LitNotCond( iObjNew, Gia_ObjPhase(pObj) );
                if ( iObjNew != 0 )
                {
                    Vec_IntPush( *pvOutputs, 0 );
                    Vec_IntPush( *pvOutputs, i );
                    Vec_IntPush( vXorLits, iObjNew );
                }
            }
            else if ( Gia_ObjIsHead( p, i ) )
            {
                iPrev = i;
                Gia_ClassForEachObj1( p, i, iObj )
                {
                    iPrevNew = Gia_ManCorrSpecReal( pNew, p, Gia_ManObj(p, iPrev), nFrames, 0 );
                    iObjNew  = Gia_ManCorrSpecReal( pNew, p, Gia_ManObj(p, iObj), nFrames, 0 );
                    iPrevNew = Abc_LitNotCond( iPrevNew, Gia_ObjPhase(pObj) ^ Gia_ObjPhase(Gia_ManObj(p, iPrev)) );
                    iObjNew  = Abc_LitNotCond( iObjNew,  Gia_ObjPhase(pObj) ^ Gia_ObjPhase(Gia_ManObj(p, iObj)) );
                    if ( iPrevNew != iObjNew && iPrevNew != 0 && iObjNew != 1 )
                    {
                        Vec_IntPush( *pvOutputs, iPrev );
                        Vec_IntPush( *pvOutputs, iObj );
                        Vec_IntPush( vXorLits, Gia_ManHashAnd(pNew, iPrevNew, Abc_LitNot(iObjNew)) );
                    }
                    iPrev = iObj;
                }
                iObj = i;
                iPrevNew = Gia_ManCorrSpecReal( pNew, p, Gia_ManObj(p, iPrev), nFrames, 0 );
                iObjNew  = Gia_ManCorrSpecReal( pNew, p, Gia_ManObj(p, iObj), nFrames, 0 );
                iPrevNew = Abc_LitNotCond( iPrevNew, Gia_ObjPhase(pObj) ^ Gia_ObjPhase(Gia_ManObj(p, iPrev)) );
                iObjNew  = Abc_LitNotCond( iObjNew,  Gia_ObjPhase(pObj) ^ Gia_ObjPhase(Gia_ManObj(p, iObj)) );
                if ( iPrevNew != iObjNew && iPrevNew != 0 && iObjNew != 1 )
                {
                    Vec_IntPush( *pvOutputs, iPrev );
                    Vec_IntPush( *pvOutputs, iObj );
                    Vec_IntPush( vXorLits, Gia_ManHashAnd(pNew, iPrevNew, Abc_LitNot(iObjNew)) );
                }
            }
        }
    }
    else
    {
        Gia_ManForEachObj1( p, pObj, i )
        {
            pRepr = Gia_ObjReprObj( p, Gia_ObjId(p,pObj) );
            if ( pRepr == NULL )
                continue;
            iPrevNew = Gia_ObjIsConst(p, i)? 0 : Gia_ManCorrSpecReal( pNew, p, pRepr, nFrames, 0 );
            iObjNew  = Gia_ManCorrSpecReal( pNew, p, pObj, nFrames, 0 );
            iObjNew  = Abc_LitNotCond( iObjNew, Gia_ObjPhase(pRepr) ^ Gia_ObjPhase(pObj) );
            if ( iPrevNew != iObjNew )
            {
                Vec_IntPush( *pvOutputs, Gia_ObjId(p, pRepr) );
                Vec_IntPush( *pvOutputs, Gia_ObjId(p, pObj) );
                Vec_IntPush( vXorLits, Gia_ManHashXor(pNew, iPrevNew, iObjNew) );
            }
        }
    }
    Vec_IntForEachEntry( vXorLits, iObjNew, i )
        Gia_ManAppendCo( pNew, iObjNew );
    Vec_IntFree( vXorLits );
    Gia_ManHashStop( pNew );
    Vec_IntErase( &p->vCopies );
//Abc_Print( 1, "Before sweeping = %d\n", Gia_ManAndNum(pNew) );
    pNew = Gia_ManCleanup( pTemp = pNew );
//Abc_Print( 1, "After sweeping = %d\n", Gia_ManAndNum(pNew) );
    Gia_ManStop( pTemp );
    return pNew;
}